

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emptytableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::EmptyTableRef::Copy(EmptyTableRef *this)

{
  _func_int **in_RAX;
  
  make_uniq<duckdb::EmptyTableRef>();
  (this->super_TableRef)._vptr_TableRef = in_RAX;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> EmptyTableRef::Copy() {
	return make_uniq<EmptyTableRef>();
}